

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **args)

{
  Box<objectbox::tsdemo::SensorValues> box;
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  OBX_model *model;
  long lVar4;
  ostream *poVar5;
  Options options;
  vector<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_> values;
  StopWatch stopWatch;
  Box<objectbox::tsdemo::SensorValues> boxSV;
  Box<objectbox::tsdemo::NamedTimeRange> boxNTR;
  Store store;
  Options local_e0;
  vector<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_> local_d8
  ;
  duration local_c0;
  BoxTypeless local_b8;
  string local_a0;
  BoxTypeless local_80;
  Store local_68;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"ObjectBox TS demo using ObjectBox library ",0x2a);
  pcVar2 = (char *)obx_version_string();
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1142b0);
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (core: ",8);
  pcVar2 = (char *)obx_version_core_string();
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1142b0);
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  cVar1 = obx_has_feature(2);
  if (cVar1 != '\0') {
    model = (OBX_model *)obx_model();
    if (model != (OBX_model *)0x0) {
      obx_model_entity(model,"NamedTimeRange",1,0x3441081f55e8228d);
      obx_model_property(model,anon_var_dwarf_133af + 0x27,6,1,0x495d3217fb1fed14);
      obx_model_property_flags(model,1);
      obx_model_property(model,"begin",10,2,0x5b821015ee281fa9);
      obx_model_property(model,"end",10,3,0x1ee66d6a77dbc649);
      obx_model_property(model,"name",9,4,0x7250114c30cbdb95);
      obx_model_entity_last_property_id(model,4,0x7250114c30cbdb95);
      obx_model_entity(model,"SensorValues",2,0x5b444a135bb7137f);
      obx_model_property(model,anon_var_dwarf_133af + 0x27,6,1,0x66911fc3e14f56ee);
      obx_model_property_flags(model,1);
      obx_model_property(model,"time",10,2,0x3822dd8e3248ec74);
      obx_model_property_flags(model,0x4000);
      obx_model_property(model,"temperatureOutside",8,3,0x105a5228614e1155);
      obx_model_property(model,"temperatureInside",8,4,0xb2651d7c696391b);
      obx_model_property(model,"temperatureCpu",8,5,0x3e2cfc77907880e2);
      obx_model_property(model,"loadCpu1",8,6,0x4e086058010bfe5f);
      obx_model_property(model,"loadCpu2",8,7,0x7440ca653dc6fed2);
      obx_model_property(model,"loadCpu3",8,8,0x1b5e2b57008f5a6e);
      obx_model_property(model,"loadCpu4",8,9,0x60849bc50f7a4b0d);
      obx_model_entity_last_property_id(model,9,0x60849bc50f7a4b0d);
      obx_model_last_entity_id(model,2,0x5b444a135bb7137f);
    }
    obx::Options::Options(&local_e0,model);
    obx_opt_max_db_size_in_kb(local_e0.opt,0xa00000);
    obx::Store::Store(&local_68,&local_e0);
    obx::BoxTypeless::BoxTypeless(&local_80,&local_68,1);
    obx::BoxTypeless::BoxTypeless(&local_b8,&local_68,2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ObjectBox store opened",0x16);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
    lVar4 = std::chrono::_V2::system_clock::now();
    obx::BoxTypeless::removeAll(&local_80);
    lVar4 = lVar4 / 1000000;
    box.super_BoxTypeless.cBox_ = local_b8.cBox_;
    box.super_BoxTypeless.store_ = local_b8.store_;
    box.super_BoxTypeless.entityTypeId_ = local_b8.entityTypeId_;
    box.super_BoxTypeless._20_4_ = local_b8._20_4_;
    removeDataBefore(box,lVar4 + -5000);
    createSensorValueData(&local_d8,lVar4,1000000);
    local_c0.__r = std::chrono::_V2::steady_clock::now();
    obx::Box<objectbox::tsdemo::SensorValues>::
    putMany<std::vector<objectbox::tsdemo::SensorValues,std::allocator<objectbox::tsdemo::SensorValues>>>
              ((Box<objectbox::tsdemo::SensorValues> *)&local_b8,&local_d8,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0,OBXPutMode_PUT);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Put ",4);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,1000000);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," objects in ",0xc);
    objectbox::StopWatch::durationForLog_abi_cxx11_(&local_a0,(StopWatch *)&local_c0);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_a0._M_dataplus._M_p,local_a0._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if (local_d8.
        super__Vector_base<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_d8.
        super__Vector_base<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_d8.
      super__Vector_base<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_d8.
           super__Vector_base<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
           ._M_impl.super__Vector_impl_data._M_start;
    }
    putAndPrintNamedTimeRanges((Box<objectbox::tsdemo::NamedTimeRange> *)&local_80,lVar4);
    printMinMaxTime((Box<objectbox::tsdemo::SensorValues> *)&local_b8,lVar4);
    buildAndRunQueries((Box<objectbox::tsdemo::SensorValues> *)&local_b8,lVar4);
    if (local_d8.
        super__Vector_base<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8.
                      super__Vector_base<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    obx::Store::~Store(&local_68);
    obx_opt_free(local_e0.opt);
    return 0;
  }
  poVar5 = std::operator<<((ostream *)&std::cout,
                           "This time series demo requires ObjectBox TS, a special time series edition."
                          );
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)&std::cout,
                           "To get ObjectBox TS, please visit https://objectbox.io/time-series-database/."
                          );
  std::endl<char,std::char_traits<char>>(poVar5);
  exit(1);
}

Assistant:

int main(int argc, char* args[]) {
    std::cout << "ObjectBox TS demo using ObjectBox library " << obx_version_string()
              << " (core: " << obx_version_core_string() << ")" << std::endl;

    if (!obx_has_feature(OBXFeature_TimeSeries)) {
        std::cout << "This time series demo requires ObjectBox TS, a special time series edition." << std::endl;
        std::cout << "To get ObjectBox TS, please visit https://objectbox.io/time-series-database/." << std::endl;
        exit(1);
    }

    // Init ObjectBox store and boxes
    obx::Options options(create_obx_model());
    options.maxDbSizeInKb(10 * 1024 * 1024);  // 10 GB to allow data from several runs
    obx::Store store(options);
    obx::Box<NamedTimeRange> boxNTR(store);
    obx::Box<SensorValues> boxSV(store);
    std::cout << "ObjectBox store opened" << std::endl;

    int64_t start = millisSinceEpoch();
    boxNTR.removeAll();
    removeDataBefore(boxSV, start - 5000);  // Older than 5s
    // boxSV.removeAll();  // Or remove all if you prefer consistent data each run

    // Create some SensorValues dummy data and put it in the database (while measuring the time for put)
    int dataCount = 1000000;
    std::vector<SensorValues> values = createSensorValueData(start, dataCount);
    StopWatch stopWatch;
    boxSV.put(values);
    std::cout << "Put " << dataCount << " objects in " << stopWatch.durationForLog() << std::endl;
    values.clear();  // Free memory for putted objects (optional)

    putAndPrintNamedTimeRanges(boxNTR, start);

    printMinMaxTime(boxSV, start);

    buildAndRunQueries(boxSV, start);

    return 0;
}